

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

void __thiscall
Args::HelpPrinter::printOnlyFor
          (HelpPrinter *this,ArgIface *arg,OutStreamType *to,size_type beforeDescription,
          size_type param_5)

{
  ulong uVar1;
  ostream *poVar2;
  string *psVar3;
  long lVar4;
  ostream *in_RDX;
  long *in_RSI;
  size_type in_RDI;
  size_type in_stack_00000018;
  size_type in_stack_00000020;
  size_type in_stack_00000028;
  StringList *in_stack_00000030;
  OutStreamType *in_stack_00000038;
  HelpPrinter *in_stack_00000040;
  size_type pos;
  ostream *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff68;
  OutStreamType *in_stack_ffffffffffffff70;
  string local_80 [32];
  String *in_stack_ffffffffffffffa0;
  HelpPrinter *in_stack_ffffffffffffffa8;
  string local_50 [32];
  long local_30;
  ostream *local_18;
  long *local_10;
  
  local_30 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x38))();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator<<(local_18,' ');
    local_30 = local_30 + 1;
    poVar2 = std::operator<<(local_18,'-');
    psVar3 = (string *)(**(code **)(*local_10 + 0x38))();
    std::operator<<(poVar2,psVar3);
    (**(code **)(*local_10 + 0x38))();
    lVar4 = std::__cxx11::string::length();
    local_30 = lVar4 + 1 + local_30;
    (**(code **)(*local_10 + 0x40))();
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::operator<<(local_18,',');
      local_30 = local_30 + 1;
    }
    else {
      uVar1 = (**(code **)(*local_10 + 0x20))();
      if ((uVar1 & 1) != 0) {
        poVar2 = std::operator<<(local_18," <");
        psVar3 = (string *)(**(code **)(*local_10 + 0x48))();
        poVar2 = std::operator<<(poVar2,psVar3);
        std::operator<<(poVar2,'>');
        (**(code **)(*local_10 + 0x48))();
        lVar4 = std::__cxx11::string::length();
        local_30 = lVar4 + 3 + local_30;
      }
    }
  }
  else {
    printOffset(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI);
    local_30 = 4;
  }
  (**(code **)(*local_10 + 0x40))();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator<<(local_18,' ');
    local_30 = local_30 + 1;
    poVar2 = std::operator<<(local_18,"--");
    psVar3 = (string *)(**(code **)(*local_10 + 0x40))();
    std::operator<<(poVar2,psVar3);
    (**(code **)(*local_10 + 0x40))();
    lVar4 = std::__cxx11::string::length();
    local_30 = lVar4 + 2 + local_30;
    uVar1 = (**(code **)(*local_10 + 0x20))();
    if ((uVar1 & 1) != 0) {
      poVar2 = std::operator<<(local_18," <");
      psVar3 = (string *)(**(code **)(*local_10 + 0x48))();
      poVar2 = std::operator<<(poVar2,psVar3);
      std::operator<<(poVar2,'>');
      (**(code **)(*local_10 + 0x48))();
      lVar4 = std::__cxx11::string::length();
      local_30 = lVar4 + 3 + local_30;
    }
  }
  else {
    (**(code **)(*local_10 + 0x38))();
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) != 0) {
      (**(code **)(*local_10 + 0x40))();
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) != 0) {
        std::operator<<(local_18,' ');
        local_30 = local_30 + 1;
        in_stack_ffffffffffffff30 = local_18;
        (**(code **)(*local_10 + 0x18))();
        std::operator<<(in_stack_ffffffffffffff30,local_50);
        std::__cxx11::string::~string(local_50);
        (**(code **)(*local_10 + 0x18))(local_80);
        lVar4 = std::__cxx11::string::length();
        local_30 = lVar4 + local_30;
        std::__cxx11::string::~string(local_80);
        uVar1 = (**(code **)(*local_10 + 0x20))();
        if ((uVar1 & 1) != 0) {
          poVar2 = std::operator<<(local_18," <");
          psVar3 = (string *)(**(code **)(*local_10 + 0x48))();
          poVar2 = std::operator<<(poVar2,psVar3);
          std::operator<<(poVar2,'>');
          (**(code **)(*local_10 + 0x48))();
          lVar4 = std::__cxx11::string::length();
          local_30 = lVar4 + 3 + local_30;
        }
      }
    }
  }
  (**(code **)(*local_10 + 0x50))();
  splitToWords(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  printString(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
              in_stack_00000020,in_stack_00000018);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff30);
  poVar2 = std::operator<<(local_18,"\n");
  std::operator<<(poVar2,"\n");
  std::ostream::flush();
  return;
}

Assistant:

inline void
HelpPrinter::printOnlyFor( ArgIface * arg, OutStreamType & to,
	String::size_type beforeDescription, String::size_type ) const
{
	String::size_type pos = 0;

	if( !arg->flag().empty() )
	{
		to << ' ';
		++pos;
		to << '-' << arg->flag();
		pos += arg->flag().length() + 1;

		if( !arg->argumentName().empty() )
		{
			to << ',';
			++pos;
		}
		else if( arg->isWithValue() )
		{
			to << " <" << arg->valueSpecifier() << '>';
			pos += arg->valueSpecifier().length() + 3;
		}
	}
	else
	{
		printOffset( to, pos, 4 );
		pos = 4;
	}

	if( !arg->argumentName().empty() )
	{
		to << ' ';
		++pos;
		to << "--" << arg->argumentName();
		pos += arg->argumentName().length() + 2;

		if( arg->isWithValue() )
		{
			to << " <" << arg->valueSpecifier() << '>';
			pos += arg->valueSpecifier().length() + 3;
		}
	}
	else if( arg->flag().empty() && arg->argumentName().empty() )
	{
		to << ' ';
		++pos;
		to << arg->name();
		pos += arg->name().length();

		if( arg->isWithValue() )
		{
			to << " <" << arg->valueSpecifier() << '>';
			pos += arg->valueSpecifier().length() + 3;
		}
	}

	printString( to, splitToWords( arg->description() ), pos,
		beforeDescription, 0 );

	to << "\n" << "\n";

	to.flush();
}